

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

ostream * __thiscall amrex::DistributionMapping::writeOn(DistributionMapping *this,ostream *os)

{
  element_type *peVar1;
  pointer piVar2;
  ostream *poVar3;
  pointer piVar4;
  long lVar5;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_23,1);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_22,1);
  peVar1 = (this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar4 = *(pointer *)
            &(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar2 = *(pointer *)
            ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  if (piVar2 != piVar4 && -1 < (long)piVar2 - (long)piVar4) {
    lVar5 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<(os,piVar4[lVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_24,1);
      lVar5 = lVar5 + 1;
      peVar1 = (this->m_ref).
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      piVar4 = *(pointer *)
                &(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
    } while (lVar5 < (long)*(pointer *)
                            ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                     (long)piVar4 >> 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("DistributionMapping::writeOn(ostream&) failed");
  }
  return os;
}

Assistant:

std::ostream&
DistributionMapping::writeOn (std::ostream& os) const
{
    os << '(' << size() << '\n';
    for (int i = 0; i < size(); ++i) {
        os << (*this)[i] << '\n';
    }
    os << ')';
    if (os.fail()) {
        amrex::Error("DistributionMapping::writeOn(ostream&) failed");
    }
    return os;
}